

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O0

void __thiscall MessageQueue::~MessageQueue(MessageQueue *this)

{
  bool bVar1;
  element_type *peVar2;
  MessageQueue *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->thread);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<MessageThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MessageThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->thread);
    MessageThread::stop(peVar2);
    peVar2 = std::__shared_ptr_access<MessageThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MessageThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->thread);
    Thread::join(&peVar2->super_Thread);
    std::__shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>);
  }
  if ((this->queue != -1) && ((this->owner & 1U) != 0)) {
    msgctl(this->queue,0,(msqid_ds *)0x0);
  }
  std::shared_ptr<MessageThread>::~shared_ptr(&this->thread);
  Signal<std::function<void_(const_Buffer_&)>_>::~Signal(&this->signalDataAvailable);
  return;
}

Assistant:

MessageQueue::~MessageQueue()
{
    if (thread) {
        thread->stop();
        thread->join();
        thread.reset();
    }
    if (queue != -1 && owner) {
        msgctl(queue, IPC_RMID, 0);
    }
}